

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst.h
# Opt level: O3

shared_ptr<mocker::nasm::Lea> __thiscall
mocker::nasm::dyc<mocker::nasm::Lea,std::shared_ptr<mocker::nasm::Inst>const&>
          (nasm *this,shared_ptr<mocker::nasm::Inst> *v)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  undefined1 auVar3 [16];
  shared_ptr<mocker::nasm::Lea> sVar4;
  
  peVar1 = (v->super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    auVar3 = __dynamic_cast(peVar1,&Inst::typeinfo,&Lea::typeinfo,0);
    in_RDX._M_pi = auVar3._8_8_;
    if (auVar3._0_8_ != 0) {
      *(long *)this = auVar3._0_8_;
      p_Var2 = (v->super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
               _M_pi;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var2;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      goto LAB_0012a8be;
    }
  }
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
LAB_0012a8be:
  sVar4.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar4.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::nasm::Lea>)
         sVar4.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> dyc(V &&v) {
  return std::dynamic_pointer_cast<T>(v);
}